

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

void __thiscall Disa::Matrix_Sparse::resize(Matrix_Sparse *this,size_t *row,size_t *column)

{
  void *__dest;
  pointer puVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ulong *puVar4;
  pointer puVar5;
  ulong *puVar6;
  pointer pdVar7;
  long lVar8;
  size_t sVar9;
  iterator __beg;
  ulong uVar10;
  unsigned_long uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pdVar14;
  ulong *__dest_00;
  long lVar15;
  unsigned_long local_38;
  
  puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar10 = *row;
  if (((long)puVar5 - (long)puVar3 != 0) && (uVar10 < ((long)puVar5 - (long)puVar3 >> 3) - 1U)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->column_index,puVar3[uVar10]);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->element_value,
               (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[*row]);
    uVar10 = *row;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar3 == puVar5) {
    local_38 = 0;
  }
  else {
    local_38 = puVar5[-1];
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->row_non_zero,uVar10 + 1,&local_38);
  uVar10 = *column;
  if (uVar10 < this->column_size) {
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)puVar5 - (long)puVar3 != 8 && puVar5 != puVar3) {
      uVar11 = *puVar3;
      lVar15 = 0;
      uVar10 = 0;
      do {
        puVar1 = (this->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = puVar3[uVar10 + 1];
        lVar8 = uVar2 - lVar15;
        __dest_00 = puVar1 + uVar11;
        uVar12 = (long)(lVar8 * 8 + uVar11 * -8) >> 3;
        if (0 < (long)uVar12) {
          do {
            uVar13 = uVar12 >> 1;
            uVar12 = ~uVar13 + uVar12;
            puVar4 = __dest_00 + uVar13 + 1;
            if (*column - 1 < __dest_00[uVar13]) {
              uVar12 = uVar13;
              puVar4 = __dest_00;
            }
            __dest_00 = puVar4;
          } while (0 < (long)uVar12);
        }
        puVar4 = puVar1 + lVar8;
        if (__dest_00 != puVar4) {
          sVar9 = (long)(this->column_index).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4;
          puVar6 = puVar4;
          if (sVar9 != 0) {
            memmove(__dest_00,puVar4,sVar9);
            puVar6 = (this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          puVar4 = (ulong *)(((long)puVar6 - (long)puVar4) + (long)__dest_00);
          if (puVar6 != puVar4) {
            (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar4;
          }
          lVar15 = (long)__dest_00 - (long)puVar1;
          if (lVar15 != lVar8 * 8) {
            pdVar14 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            __dest = (void *)((long)pdVar14 + lVar15);
            pdVar14 = pdVar14 + lVar8;
            sVar9 = (long)(this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar14;
            pdVar7 = pdVar14;
            if (sVar9 != 0) {
              memmove(__dest,pdVar14,sVar9);
              pdVar7 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            pdVar14 = (pointer)((long)__dest + ((long)pdVar7 - (long)pdVar14));
            if (pdVar7 != pdVar14) {
              (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = pdVar14;
            }
          }
          lVar15 = uVar2 - (lVar15 >> 3);
          puVar5 = (this->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar10 = uVar10 + 1;
        puVar3 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = puVar3[uVar10] - lVar15;
        puVar3[uVar10] = uVar11;
      } while (((long)puVar5 - (long)puVar3 != 0) &&
              (uVar10 < ((long)puVar5 - (long)puVar3 >> 3) - 1U));
      uVar10 = *column;
    }
  }
  this->column_size = uVar10;
  return;
}

Assistant:

void Matrix_Sparse::resize(const std::size_t& row, const std::size_t& column) {

  // resize rows first
  if(row < size_row()) {
    column_index.resize(row_non_zero[row]);
    element_value.resize(row_non_zero[row]);
  }
  row_non_zero.resize(row + 1, row_non_zero.empty() ? 0 : row_non_zero.back());

  // resize columns
  // Note: Since we may have to do column erases over multiple rows we do it directly here rather than use erase().
  if(column < size_column()) {
    std::size_t offset_loss = 0;
    FOR(i_row, size_row()) {
      const auto& iter_column_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1] - offset_loss);
      auto iter_column =
      std::upper_bound(column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]), iter_column_end, column - 1);
      if(iter_column != iter_column_end) {
        const s_size_t& start_distance = std::distance(column_index.begin(), iter_column);
        const s_size_t& end_distance = std::distance(column_index.begin(), iter_column_end);
        column_index.erase(iter_column, iter_column_end);
        element_value.erase(element_value.begin() + start_distance, element_value.begin() + end_distance);
        offset_loss += end_distance - start_distance;
      }
      row_non_zero[i_row + 1] -= offset_loss;
    }
  }
  column_size = column;
}